

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImDrawList * GetViewportDrawList(ImGuiViewportP *viewport,size_t drawlist_no,char *drawlist_name)

{
  ImVec2 cr_min;
  ImGuiContext *pIVar1;
  ImVec2 cr_max;
  ImDrawList *local_30;
  ImDrawList *draw_list;
  ImGuiContext *g;
  char *drawlist_name_local;
  size_t drawlist_no_local;
  ImGuiViewportP *viewport_local;
  
  pIVar1 = GImGui;
  if (drawlist_no < 2) {
    local_30 = viewport->DrawLists[drawlist_no];
    if (local_30 == (ImDrawList *)0x0) {
      ImGui::MemAlloc(0xc0);
      local_30 = (ImDrawList *)operator_new(0xc0);
      ImDrawList::ImDrawList(local_30,&pIVar1->DrawListSharedData);
      local_30->_OwnerName = drawlist_name;
      viewport->DrawLists[drawlist_no] = local_30;
    }
    if (viewport->LastFrameDrawLists[drawlist_no] != pIVar1->FrameCount) {
      ImDrawList::_ResetForNewFrame(local_30);
      ImDrawList::PushTextureID(local_30,((pIVar1->IO).Fonts)->TexID);
      cr_min = (viewport->super_ImGuiViewport).Pos;
      cr_max = operator+(&(viewport->super_ImGuiViewport).Pos,&(viewport->super_ImGuiViewport).Size)
      ;
      ImDrawList::PushClipRect(local_30,cr_min,cr_max,false);
      viewport->LastFrameDrawLists[drawlist_no] = pIVar1->FrameCount;
    }
    return local_30;
  }
  __assert_fail("drawlist_no < ((int)(sizeof(viewport->DrawLists) / sizeof(*(viewport->DrawLists))))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                ,0xd66,"ImDrawList *GetViewportDrawList(ImGuiViewportP *, size_t, const char *)");
}

Assistant:

static ImDrawList* GetViewportDrawList(ImGuiViewportP* viewport, size_t drawlist_no, const char* drawlist_name)
{
    // Create the draw list on demand, because they are not frequently used for all viewports
    ImGuiContext& g = *GImGui;
    IM_ASSERT(drawlist_no < IM_ARRAYSIZE(viewport->DrawLists));
    ImDrawList* draw_list = viewport->DrawLists[drawlist_no];
    if (draw_list == NULL)
    {
        draw_list = IM_NEW(ImDrawList)(&g.DrawListSharedData);
        draw_list->_OwnerName = drawlist_name;
        viewport->DrawLists[drawlist_no] = draw_list;
    }

    // Our ImDrawList system requires that there is always a command
    if (viewport->LastFrameDrawLists[drawlist_no] != g.FrameCount)
    {
        draw_list->_ResetForNewFrame();
        draw_list->PushTextureID(g.IO.Fonts->TexID);
        draw_list->PushClipRect(viewport->Pos, viewport->Pos + viewport->Size, false);
        viewport->LastFrameDrawLists[drawlist_no] = g.FrameCount;
    }
    return draw_list;
}